

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O2

void __thiscall CTxMemPoolEntry::CTxMemPoolEntry(CTxMemPoolEntry *this,CTxMemPoolEntry *param_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::_Rb_tree(&(this->m_parents)._M_t,&(param_1->m_parents)._M_t);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::_Rb_tree(&(this->m_children)._M_t,&(param_1->m_children)._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    memcpy(&this->nFee,&param_1->nFee,0xa0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPoolEntry(const CTxMemPoolEntry&) = default;